

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

void __thiscall
pbrt::AliasTable::AliasTable(AliasTable *this,span<const_float> weights,Allocator alloc)

{
  Bin **ppBVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  Bin *pBVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Float *pFVar8;
  pointer pOVar9;
  size_t sVar10;
  pointer pOVar11;
  pointer pOVar12;
  ulong uVar13;
  long lVar14;
  pointer pOVar15;
  size_t i;
  ulong uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 in_ZMM5 [64];
  Float va;
  undefined1 auStack_74 [12];
  pointer local_68;
  vector<Outcome,_std::allocator<Outcome>_> over;
  value_type local_40;
  
  uVar13 = weights.n;
  (this->bins).alloc.memoryResource = alloc.memoryResource;
  (this->bins).nStored = 0;
  (this->bins).ptr = (Bin *)0x0;
  (this->bins).nAlloc = 0;
  pstd::vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
  reserve(&this->bins,uVar13);
  if (uVar13 == 0) {
    (this->bins).nStored = 0;
    auVar6._12_4_ = 0;
    auVar6._0_12_ = auStack_74;
    _va = auVar6 << 0x20;
  }
  else {
    ppBVar1 = &(this->bins).ptr;
    lVar14 = 0;
    memset((this->bins).ptr,0,uVar13 * 0xc);
    auVar23 = in_ZMM5._0_32_;
    va = 0.0;
    (this->bins).nStored = uVar13;
    do {
      pfVar2 = (float *)((long)weights.ptr + lVar14);
      lVar14 = lVar14 + 4;
      va = va + *pfVar2;
    } while (uVar13 * 4 - lVar14 != 0);
    if (0.0 < va) {
      if (uVar13 == 0) {
        _va = ZEXT816(0) << 0x20;
        pOVar12 = (pointer)0x0;
        local_68 = (pointer)0x0;
        over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        pOVar9 = (pointer)0x0;
        pOVar15 = (pointer)0x0;
        over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.super__Vector_impl_data.
        _0_16_ = _va;
      }
      else {
        sVar10 = 0;
        pFVar8 = &(*ppBVar1)->pdf;
        do {
          pfVar2 = weights.ptr + sVar10;
          sVar10 = sVar10 + 1;
          *pFVar8 = *pfVar2 / va;
          pFVar8 = pFVar8 + 3;
        } while (uVar13 != sVar10);
        _va = ZEXT816(0) << 0x20;
        lVar14 = 4;
        uVar16 = 0;
        local_68 = (pointer)0x0;
        over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.super__Vector_impl_data.
        _0_16_ = _va;
        do {
          auVar6 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,uVar13);
          local_40.pHat = auVar6._0_4_ * *(float *)((long)&(*ppBVar1)->q + lVar14);
          local_40.index = uVar16;
          if (1.0 <= local_40.pHat) {
            std::vector<Outcome,_std::allocator<Outcome>_>::push_back(&over,&local_40);
          }
          else {
            std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                      ((vector<Outcome,_std::allocator<Outcome>_> *)&va,&local_40);
          }
          auVar23 = in_ZMM5._0_32_;
          uVar13 = (this->bins).nStored;
          uVar16 = uVar16 + 1;
          lVar14 = lVar14 + 0xc;
        } while (uVar16 < uVar13);
        pOVar15 = _va;
        pOVar9 = (pointer)auStack_74._4_8_;
        if (_va != (pointer)auStack_74._4_8_) {
          do {
            auVar23 = in_ZMM5._0_32_;
            pOVar12 = over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
                super__Vector_impl_data._M_start ==
                over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
                super__Vector_impl_data._M_finish) goto LAB_004759e3;
            fVar3 = pOVar9[-1].pHat;
            sVar10 = pOVar9[-1].index;
            local_40.index =
                 over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].index;
            fVar4 = over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].pHat;
            auStack_74._4_8_ = pOVar9 + -1;
            over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
            pBVar5 = *ppBVar1;
            pBVar5[sVar10].q = fVar3;
            local_40.pHat = fVar3 + fVar4 + -1.0;
            pBVar5[sVar10].alias = (int)local_40.index;
            if (1.0 <= local_40.pHat) {
              std::vector<Outcome,_std::allocator<Outcome>_>::push_back(&over,&local_40);
              pOVar9 = pOVar9 + -1;
            }
            else {
              std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                        ((vector<Outcome,_std::allocator<Outcome>_> *)&va,&local_40);
              pOVar15 = _va;
              pOVar9 = (pointer)auStack_74._4_8_;
            }
            auVar23 = in_ZMM5._0_32_;
          } while (pOVar15 != pOVar9);
        }
        pOVar12 = over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
LAB_004759e3:
      if (pOVar12 !=
          over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.super__Vector_impl_data
          ._M_finish) {
        auVar22._8_4_ = 0x3f800000;
        auVar22._0_8_ = 0x3f8000003f800000;
        auVar22._12_4_ = 0x3f800000;
        auVar22._16_4_ = 0x3f800000;
        auVar22._20_4_ = 0x3f800000;
        auVar22._24_4_ = 0x3f800000;
        auVar22._28_4_ = 0x3f800000;
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        vpmovsxbd_avx2(ZEXT816(0x90a0b0c0d0e0f000));
        auVar18 = vpbroadcastq_avx512f(ZEXT816(0xc));
        pBVar5 = *ppBVar1;
        auVar23 = vpcmpeqd_avx2(auVar23,auVar23);
        uVar13 = 0;
        auVar19 = vpbroadcastq_avx512f();
        auVar19 = vpsrlq_avx512f(auVar19,4);
        pOVar11 = over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          auVar20 = vpbroadcastq_avx512f();
          uVar13 = uVar13 + 8;
          auVar20 = vporq_avx512f(auVar20,auVar17);
          uVar16 = vpcmpuq_avx512f(auVar20,auVar19,2);
          auVar20 = vpgatherdq_avx512f(*(undefined4 *)((long)&pOVar11[-1].index + (long)pBVar5));
          auVar21._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * auVar20._8_8_;
          auVar21._0_8_ = (ulong)((byte)uVar16 & 1) * auVar20._0_8_;
          auVar21._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * auVar20._16_8_;
          auVar21._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * auVar20._24_8_;
          auVar21._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * auVar20._32_8_;
          auVar21._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * auVar20._40_8_;
          auVar21._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * auVar20._48_8_;
          auVar21._56_8_ = (uVar16 >> 7) * auVar20._56_8_;
          pOVar11 = pOVar11 + -8;
          auVar20 = vpmullq_avx512dq(auVar21,auVar18);
          vscatterqps_avx512f(ZEXT864(pBVar5) + auVar20,uVar16,auVar22);
          vpscatterqd_avx512f(ZEXT832(pBVar5) + ZEXT832(8) + auVar20._0_32_,uVar16,auVar23);
        } while ((((ulong)((long)over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.
                                 super__Vector_impl_data._M_finish + (-0x10 - (long)pOVar12)) >> 4)
                  + 8 & 0xfffffffffffffff8) != uVar13);
      }
      if (pOVar15 != pOVar9) {
        pBVar5 = *ppBVar1;
        do {
          sVar10 = pOVar9[-1].index;
          pOVar9 = pOVar9 + -1;
          pBVar5[sVar10].q = 1.0;
          pBVar5[sVar10].alias = -1;
        } while (pOVar9 != pOVar15);
        auStack_74._4_8_ = pOVar9;
      }
      if (pOVar12 != (pointer)0x0) {
        operator_delete(pOVar12,(long)over.super__Vector_base<Outcome,_std::allocator<Outcome>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pOVar12);
      }
      if (pOVar15 == (pointer)0x0) {
        return;
      }
      operator_delete(pOVar15,(long)local_68 - (long)pOVar15);
      return;
    }
  }
  auVar7._12_4_ = 0;
  auVar7._0_12_ =
       (undefined1  [12])
       over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.super__Vector_impl_data.
       _4_12_;
  over.super__Vector_base<Outcome,_std::allocator<Outcome>_>._M_impl.super__Vector_impl_data._0_16_
       = auVar7 << 0x20;
  LogFatal<char_const(&)[4],char_const(&)[2],char_const(&)[4],float&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
             ,0x234,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])"sum",
             (char (*) [2])0x56f16e,(char (*) [4])"sum",&va,(char (*) [2])0x56f16e,(int *)&over);
}

Assistant:

AliasTable::AliasTable(pstd::span<const Float> weights, Allocator alloc)
    : bins(weights.size(), alloc) {
    // Normalize _weights_ to compute alias table PDF
    Float sum = std::accumulate(weights.begin(), weights.end(), 0.);
    CHECK_GT(sum, 0);
    for (size_t i = 0; i < weights.size(); ++i)
        bins[i].pdf = weights[i] / sum;

    // Create alias table work lists
    struct Outcome {
        Float pHat;
        size_t index;
    };
    std::vector<Outcome> under, over;
    for (size_t i = 0; i < bins.size(); ++i) {
        // Add outcome _i_ to an alias table work list
        Float pHat = bins[i].pdf * bins.size();
        if (pHat < 1)
            under.push_back(Outcome{pHat, i});
        else
            over.push_back(Outcome{pHat, i});
    }

    // Process under and over work item together
    while (!under.empty() && !over.empty()) {
        // Remove an item from each alias table work list
        Outcome un = under.back(), ov = over.back();
        under.pop_back();
        over.pop_back();

        // Initialize probability and alias for _un_
        bins[un.index].q = un.pHat;
        bins[un.index].alias = ov.index;

        // Push excess probability on to work list
        Float pExcess = (un.pHat + ov.pHat) - 1;
        if (pExcess < 1)
            under.push_back(Outcome{pExcess, ov.index});
        else
            over.push_back(Outcome{pExcess, ov.index});
    }

    // Handle remaining alias table work items
    while (!over.empty()) {
        Outcome ov = over.back();
        over.pop_back();
        bins[ov.index].q = 1;
        bins[ov.index].alias = -1;
    }
    while (!under.empty()) {
        Outcome un = under.back();
        under.pop_back();
        bins[un.index].q = 1;
        bins[un.index].alias = -1;
    }
}